

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfileselector.cpp
# Opt level: O1

int __thiscall
QFileSelector::select
          (QFileSelector *this,int __nfds,fd_set *__readfds,fd_set *__writefds,fd_set *__exceptfds,
          timeval *__timeout)

{
  undefined8 uVar1;
  _func_int **pp_Var2;
  QArrayData *data;
  undefined8 uVar3;
  undefined8 uVar4;
  QBindingStatus *pQVar5;
  bool bVar6;
  int iVar7;
  undefined4 extraout_var;
  char *__writefds_00;
  undefined4 in_register_00000034;
  long in_FS_OFFSET;
  QLatin1StringView rhs;
  QLatin1StringView rhs_00;
  QStringView lhs;
  QStringView lhs_00;
  undefined1 local_a8 [32];
  undefined1 local_88 [32];
  undefined1 local_68 [40];
  QBindingStatus *pQStack_40;
  ExtraData *local_38;
  AtomicType local_30;
  
  local_30._M_b._M_p = *(__base_type *)(in_FS_OFFSET + 0x28);
  uVar1 = *(undefined8 *)(CONCAT44(in_register_00000034,__nfds) + 8);
  QUrl::scheme((QString *)local_68,(QUrl *)__readfds);
  __writefds_00 = (char *)__writefds;
  if ((ExtraData *)local_68._16_8_ == (ExtraData *)0x3) {
    rhs.m_data = "qrc";
    rhs.m_size = 3;
    __writefds_00 = "qrc";
    lhs.m_data = (storage_type_conflict *)local_68._8_8_;
    lhs.m_size = 3;
    bVar6 = QtPrivate::equalStrings(lhs,rhs);
    if (!bVar6) goto LAB_0023d091;
    if ((QArrayData *)local_68._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_68._0_8_,2,0x10);
      }
    }
  }
  else {
LAB_0023d091:
    bVar6 = QUrl::isLocalFile((QUrl *)__readfds);
    if ((QArrayData *)local_68._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_68._0_8_,2,0x10);
      }
    }
    if (!bVar6) {
      QUrl::QUrl((QUrl *)this,(QUrl *)__readfds);
      goto LAB_0023d46a;
    }
  }
  (this->super_QObject)._vptr_QObject = (_func_int **)&DAT_aaaaaaaaaaaaaaaa;
  QUrl::QUrl((QUrl *)this,(QUrl *)__readfds);
  QUrl::scheme((QString *)local_68,(QUrl *)__readfds);
  if ((ExtraData *)local_68._16_8_ == (ExtraData *)0x3) {
    rhs_00.m_data = "qrc";
    rhs_00.m_size = 3;
    __writefds_00 = "qrc";
    lhs_00.m_data = (storage_type_conflict *)local_68._8_8_;
    lhs_00.m_size = 3;
    bVar6 = QtPrivate::equalStrings(lhs_00,rhs_00);
  }
  else {
    bVar6 = false;
  }
  if ((QArrayData *)local_68._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_68._0_8_,2,0x10);
    }
  }
  iVar7 = (int)uVar1;
  if (bVar6 == false) {
    local_68._0_8_ = (QArrayData *)0x0;
    local_68._8_8_ = (QBindingStatus *)0x0;
    local_68._16_8_ = (ExtraData *)0x0;
    bVar6 = QUrl::hasFragment((QUrl *)this);
    if (bVar6) {
      QUrl::fragment((QString *)(local_68 + 0x20),(QUrl *)this,(ComponentFormattingOptions)0x0);
      __writefds_00 = (char *)local_38;
      uVar4 = local_68._32_8_;
      uVar3 = local_68._8_8_;
      uVar1 = local_68._0_8_;
      local_68._32_8_ = local_68._0_8_;
      local_68._0_8_ = uVar4;
      local_68._8_8_ = pQStack_40;
      pQStack_40 = (QBindingStatus *)uVar3;
      local_38 = (ExtraData *)local_68._16_8_;
      local_68._16_8_ = __writefds_00;
      if ((QArrayData *)uVar1 != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)uVar1)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)uVar1)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)uVar1)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)uVar1,2,0x10);
        }
      }
    }
    local_68._32_8_ = (QArrayData *)0x0;
    pQStack_40 = (QBindingStatus *)0x0;
    local_38 = (ExtraData *)0x0;
    bVar6 = QUrl::hasQuery((QUrl *)this);
    if (bVar6) {
      QUrl::query((QString *)local_88,(QUrl *)this,(ComponentFormattingOptions)0x0);
      pQVar5 = pQStack_40;
      uVar3 = local_68._32_8_;
      __writefds_00 = (char *)local_88._16_8_;
      uVar1 = local_88._0_8_;
      local_88._0_8_ = local_68._32_8_;
      local_68._32_8_ = uVar1;
      pQStack_40 = (QBindingStatus *)local_88._8_8_;
      local_88._8_8_ = pQVar5;
      local_88._16_8_ = local_38;
      local_38 = (ExtraData *)__writefds_00;
      if ((QArrayData *)uVar3 != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)uVar3)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)uVar3)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)uVar3)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)uVar3,2,0x10);
        }
      }
    }
    QUrl::toLocalFile((QString *)local_a8,(QUrl *)this);
    QFileSelectorPrivate::select
              ((QFileSelectorPrivate *)local_88,iVar7,(fd_set *)local_a8,(fd_set *)__writefds_00,
               __exceptfds,__timeout);
    QUrl::fromLocalFile((QUrl *)(local_a8 + 0x18),(QString *)local_88);
    pp_Var2 = (this->super_QObject)._vptr_QObject;
    (this->super_QObject)._vptr_QObject = (_func_int **)local_a8._24_8_;
    local_a8._24_8_ = pp_Var2;
    QUrl::~QUrl((QUrl *)(local_a8 + 0x18));
    if ((QArrayData *)local_88._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
      }
    }
    if ((QArrayData *)local_a8._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_a8._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_a8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_a8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_a8._0_8_,2,0x10);
      }
    }
    if ((QBindingStatus *)local_68._8_8_ != (QBindingStatus *)0x0) {
      QUrl::setFragment((QUrl *)this,(QString *)local_68,TolerantMode);
    }
    if (pQStack_40 != (QBindingStatus *)0x0) {
      QUrl::setQuery((QUrl *)this,(QString *)(local_68 + 0x20),TolerantMode);
    }
    if ((QArrayData *)local_68._32_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_68._32_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_68._32_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_68._32_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_68._32_8_,2,0x10);
      }
    }
    if ((QArrayData *)local_68._0_8_ == (QArrayData *)0x0) goto LAB_0023d46a;
    LOCK();
    (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    iVar7 = (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i;
    UNLOCK();
    data = (QArrayData *)local_68._0_8_;
  }
  else {
    local_a8._0_8_ = (QArrayData *)0x1;
    local_a8._8_8_ = ":";
    local_38 = (ExtraData *)&DAT_aaaaaaaaaaaaaaaa;
    local_68._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
    pQStack_40 = (QBindingStatus *)&DAT_aaaaaaaaaaaaaaaa;
    QUrl::path((QString *)local_88,(QUrl *)__readfds,(ComponentFormattingOptions)0x7f00000);
    local_68._24_8_ = local_88._16_8_;
    local_68._16_8_ = local_88._8_8_;
    local_68._8_8_ = local_88._0_8_;
    local_88._0_8_ = (QArrayData *)0x0;
    local_88._8_8_ = (QBindingStatus *)0x0;
    local_88._16_8_ = (ExtraData *)0x0;
    local_68._0_8_ = (QLatin1String *)local_a8;
    QStringBuilder<QLatin1String_&,_QString>::convertTo<QString>
              ((QString *)(local_68 + 0x20),(QStringBuilder<QLatin1String_&,_QString> *)local_68);
    if ((QArrayData *)local_68._8_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_68._8_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_68._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_68._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_68._8_8_,2,0x10);
      }
    }
    if ((QArrayData *)local_88._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
      }
    }
    local_68._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_68._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QFileSelectorPrivate::select
              ((QFileSelectorPrivate *)local_68,iVar7,(fd_set *)(local_68 + 0x20),
               (fd_set *)__writefds_00,__exceptfds,__timeout);
    iVar7 = QString::remove((QString *)local_68,(char *)0x0);
    QUrl::setPath((QUrl *)this,(QString *)CONCAT44(extraout_var,iVar7),DecodedMode);
    if ((QArrayData *)local_68._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_68._0_8_,2,0x10);
      }
    }
    if ((QArrayData *)local_68._32_8_ == (QArrayData *)0x0) goto LAB_0023d46a;
    LOCK();
    (((QBasicAtomicInt *)local_68._32_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_68._32_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    iVar7 = (((QBasicAtomicInt *)local_68._32_8_)->_q_value).super___atomic_base<int>._M_i;
    UNLOCK();
    data = (QArrayData *)local_68._32_8_;
  }
  if (iVar7 == 0) {
    QArrayData::deallocate(data,2,0x10);
  }
LAB_0023d46a:
  if ((__base_type)*(__pointer_type *)(in_FS_OFFSET + 0x28) == local_30._M_b._M_p) {
    return (int)this;
  }
  __stack_chk_fail();
}

Assistant:

QUrl QFileSelector::select(const QUrl &filePath) const
{
    Q_D(const QFileSelector);
    if (!isLocalScheme(filePath.scheme()) && !filePath.isLocalFile())
        return filePath;
    QUrl ret(filePath);
    if (isLocalScheme(filePath.scheme())) {
        auto scheme = ":"_L1;
#ifdef Q_OS_ANDROID
        // use other scheme because ":" means "qrc" here
        if (filePath.scheme() == "assets"_L1)
            scheme = "assets:"_L1;
#endif

        QString equivalentPath = scheme + filePath.path();
        QString selectedPath = d->select(equivalentPath);
        ret.setPath(selectedPath.remove(0, scheme.size()));
    } else {
        // we need to store the original query and fragment, since toLocalFile() will strip it off
        QString frag;
        if (ret.hasFragment())
            frag = ret.fragment();
        QString query;
        if (ret.hasQuery())
            query= ret.query();
        ret = QUrl::fromLocalFile(d->select(ret.toLocalFile()));
        if (!frag.isNull())
            ret.setFragment(frag);
        if (!query.isNull())
            ret.setQuery(query);
    }
    return ret;
}